

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O3

StatusOr<long> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetInt64
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  uint uVar1;
  bool bVar2;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 aVar3;
  pointer prVar4;
  LogMessage *this_00;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aVar5;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aVar6;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 this_01;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 this_02;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 this_03;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 this_04;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 this_05;
  UntypedMessage *this_06;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aVar7;
  int32_t field_number;
  ulong uVar8;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 aVar9;
  UntypedMessage *pUVar10;
  Span<const_long> SVar11;
  StatusOr<long> SVar12;
  Span<const_unsigned_long> SVar13;
  StatusOr<long> SVar14;
  Span<const_int> SVar15;
  StatusOr<long> SVar16;
  Span<const_unsigned_int> SVar17;
  StatusOr<long> SVar18;
  Span<const_google::protobuf::json_internal::UntypedMessage::Bool> SVar19;
  StatusOr<long> SVar20;
  StatusOr<long> SVar21;
  Span<const_google::protobuf::json_internal::UntypedMessage> SVar22;
  StatusOr<long> SVar23;
  StatusOr<long> SVar24;
  int32_t iStack_dc;
  iterator iStack_d8;
  int32_t iStack_c4;
  iterator iStack_c0;
  undefined8 uStack_b0;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aStack_98;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aStack_80;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aStack_68;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aStack_50;
  anon_union_8_1_1246618d_for_StatusOrData<long>_1 aStack_40;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aStack_38;
  UnparseProto3Type *pUStack_28;
  size_t sStack_20;
  
  uVar1 = (f->raw_->field_0)._impl_.number_;
  uVar8 = (ulong)uVar1;
  sStack_20 = 0x2d3a4f;
  aVar7 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)idx;
  SVar11 = UntypedMessage::Get<long>(msg,uVar1);
  SVar12.super_StatusOrData<long>.field_1.data_ = SVar11.len_;
  if (idx < (ulong)SVar12.super_StatusOrData<long>.field_1) {
    *(long *)(this + 8) = SVar11.ptr_[idx];
    *(undefined8 *)this = 1;
    SVar12.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)this
    ;
    return (StatusOr<long>)SVar12.super_StatusOrData<long>;
  }
  sStack_20 = 0x2d3a73;
  GetInt64();
  uVar1 = *(uint *)(*(long *)(uVar8 + 8) + 0x50);
  uVar8 = (ulong)uVar1;
  aStack_38 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x2d3a8d;
  aVar5 = aVar7;
  aVar3 = this_01;
  pUStack_28 = this;
  sStack_20 = idx;
  SVar13 = UntypedMessage::Get<unsigned_long>((UntypedMessage *)this_01,uVar1);
  SVar14.super_StatusOrData<long>.field_1.data_ = SVar13.len_;
  if ((ulong)aVar7 < (ulong)SVar14.super_StatusOrData<long>.field_1) {
    (((flat_hash_map<_183d73f4_> *)((long)msg + 8))->super_raw_hash_map<_2385b75b_>).
    super_raw_hash_set<_2385b75b_>.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = SVar13.ptr_[aVar7.data_];
    msg->desc_ = 1;
    SVar14.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)msg;
    return (StatusOr<long>)SVar14.super_StatusOrData<long>;
  }
  aStack_38 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x2d3ab1;
  GetUInt64();
  uVar1 = *(uint *)(*(long *)(uVar8 + 8) + 0x50);
  uVar8 = (ulong)uVar1;
  aStack_50 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x2d3acb;
  aVar6 = aVar5;
  aVar9 = this_02;
  aStack_40 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)msg;
  aStack_38 = aVar7;
  SVar15 = UntypedMessage::Get<int>((UntypedMessage *)this_02,uVar1);
  SVar16.super_StatusOrData<long>.field_1.data_ = SVar15.len_;
  if ((ulong)aVar5 < (ulong)SVar16.super_StatusOrData<long>.field_1) {
    *(int *)&(((flat_hash_map<_183d73f4_> *)((long)aVar3 + 8))->super_raw_hash_map<_2385b75b_>).
             super_raw_hash_set<_2385b75b_>.settings_.
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             capacity_ = SVar15.ptr_[aVar5.data_];
    *(undefined8 *)aVar3 = 1;
    SVar16.super_StatusOrData<long>.field_0 = aVar3;
    return (StatusOr<long>)SVar16.super_StatusOrData<long>;
  }
  aStack_50.data_ = (long)GetUInt32;
  GetInt32();
  uVar1 = *(uint *)(*(long *)(uVar8 + 8) + 0x50);
  uVar8 = (ulong)uVar1;
  aStack_68 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x2d3b07;
  aVar7 = aVar6;
  aVar3 = this_03;
  aStack_50 = aVar5;
  SVar17 = UntypedMessage::Get<unsigned_int>((UntypedMessage *)this_03,uVar1);
  SVar18.super_StatusOrData<long>.field_1.data_ = SVar17.len_;
  if ((ulong)aVar6 < (ulong)SVar18.super_StatusOrData<long>.field_1) {
    *(uint *)&(((flat_hash_map<_183d73f4_> *)((long)aVar9 + 8))->super_raw_hash_map<_2385b75b_>).
              super_raw_hash_set<_2385b75b_>.settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_ = SVar17.ptr_[aVar6.data_];
    *(undefined8 *)aVar9 = 1;
    SVar18.super_StatusOrData<long>.field_0 = aVar9;
    return (StatusOr<long>)SVar18.super_StatusOrData<long>;
  }
  aStack_68.data_ = (long)GetBool;
  GetUInt32();
  uVar1 = *(uint *)(*(long *)(uVar8 + 8) + 0x50);
  uVar8 = (ulong)uVar1;
  aStack_80 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x2d3b43;
  aVar5 = aVar7;
  aVar9 = this_04;
  aStack_68 = aVar6;
  SVar19 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage::Bool>
                     ((UntypedMessage *)this_04,uVar1);
  SVar20.super_StatusOrData<long>.field_1.data_ = SVar19.len_;
  if ((ulong)aVar7 < (ulong)SVar20.super_StatusOrData<long>.field_1) {
    *(bool *)&(((flat_hash_map<_183d73f4_> *)((long)aVar3 + 8))->super_raw_hash_map<_2385b75b_>).
              super_raw_hash_set<_2385b75b_>.settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_ = SVar19.ptr_[aVar7.data_] == kTrue;
    *(undefined8 *)aVar3 = 1;
    SVar20.super_StatusOrData<long>.field_0 = aVar3;
    return (StatusOr<long>)SVar20.super_StatusOrData<long>;
  }
  aStack_80.data_ = (long)GetEnumValue;
  GetBool();
  uVar1 = *(uint *)(*(long *)(uVar8 + 8) + 0x50);
  uVar8 = (ulong)uVar1;
  aStack_98 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x2d3b81;
  aVar6 = aVar5;
  aVar3 = this_05;
  aStack_80 = aVar7;
  SVar15 = UntypedMessage::Get<int>((UntypedMessage *)this_05,uVar1);
  SVar21.super_StatusOrData<long>.field_1.data_ = SVar15.len_;
  if ((ulong)aVar5 < (ulong)SVar21.super_StatusOrData<long>.field_1) {
    *(int *)&(((flat_hash_map<_183d73f4_> *)((long)aVar9 + 8))->super_raw_hash_map<_2385b75b_>).
             super_raw_hash_set<_2385b75b_>.settings_.
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             capacity_ = SVar15.ptr_[aVar5.data_];
    *(undefined8 *)aVar9 = 1;
    SVar21.super_StatusOrData<long>.field_0 = aVar9;
    return (StatusOr<long>)SVar21.super_StatusOrData<long>;
  }
  aStack_98.data_ = (long)GetMessage;
  GetEnumValue();
  field_number = *(int32_t *)(*(long *)(uVar8 + 8) + 0x50);
  uStack_b0 = 0x2d3bbd;
  pUVar10 = this_06;
  aStack_98 = aVar5;
  SVar22 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage>
                     (this_06,field_number);
  SVar23.super_StatusOrData<long>.field_1.data_ = SVar22.len_;
  if ((ulong)aVar6 < (ulong)SVar23.super_StatusOrData<long>.field_1) {
    (((flat_hash_map<_183d73f4_> *)((long)aVar3 + 8))->super_raw_hash_map<_2385b75b_>).
    super_raw_hash_set<_2385b75b_>.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = (size_t)(SVar22.ptr_ + aVar6.data_);
    *(undefined8 *)aVar3 = 1;
    SVar23.super_StatusOrData<long>.field_0 = aVar3;
    return (StatusOr<long>)SVar23.super_StatusOrData<long>;
  }
  uStack_b0 = 0x2d3be5;
  GetMessage();
  iStack_dc = field_number;
  iStack_c0 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::find<int>
                        ((raw_hash_set<_2385b75b_> *)&pUVar10->fields_,&iStack_dc);
  iStack_d8.ctrl_ = (ctrl_t *)0x0;
  bVar2 = absl::lts_20240722::container_internal::operator==(&iStack_c0,&iStack_d8);
  aVar7.data_ = 0;
  aVar3 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x0;
  if (!bVar2) {
    prVar4 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::operator->
                       (&iStack_c0);
    if (*(__index_type *)
         ((long)&(prVar4->second).
                 super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                 .
                 super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
         + 0x28) == '\x05') {
      aVar3 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)&prVar4->second;
      aVar7.data_ = 1;
    }
    else {
      prVar4 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::
               operator->(&iStack_c0);
      if (*(__index_type *)
           ((long)&(prVar4->second).
                   super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                   .
                   super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
           + 0x28) != '\x0e') {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&iStack_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.h"
                   ,0xc9,5,"false");
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (&iStack_d8,0x23,"wrong type for UntypedMessage::Get(");
        iStack_c4 = iStack_dc;
        this_00 = (LogMessage *)
                  _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                            (&iStack_d8);
        absl::lts_20240722::log_internal::LogMessage::operator<<(this_00,(char (*) [2])0x37a3cb);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&iStack_d8);
      }
      aVar3 = *(anon_union_8_1_1246618d_for_StatusOrData<long>_1 *)
               &(prVar4->second).
                super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                .
                super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                .
                super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
      ;
      aVar7.data_ = *(long *)((long)&(prVar4->second).
                                     super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                                     .
                                     super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                     .
                                     super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                     .
                                     super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                     .
                                     super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                                     .
                                     super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                             + 8) - (long)aVar3 >> 2;
    }
  }
  SVar24.super_StatusOrData<long>.field_1.data_ = aVar7.data_;
  SVar24.super_StatusOrData<long>.field_0 = aVar3;
  return (StatusOr<long>)SVar24.super_StatusOrData<long>;
}

Assistant:

static absl::StatusOr<int64_t> GetInt64(Field f, const Msg& msg,
                                          size_t idx = 0) {
    return msg.Get<int64_t>(f->proto().number())[idx];
  }